

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O0

Flags * __thiscall
flow::util::Flags::defineBool
          (Flags *this,string *longOpt,char shortOpt,string *helpText,
          function<void_(bool)> *callback)

{
  function<void_(bool)> *helpText_00;
  Flags *pFVar1;
  function<void_(bool)> local_d8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  allocator<char> local_51;
  string local_50;
  function<void_(bool)> *local_30;
  function<void_(bool)> *callback_local;
  string *helpText_local;
  string *psStack_18;
  char shortOpt_local;
  string *longOpt_local;
  Flags *this_local;
  
  local_30 = callback;
  callback_local = (function<void_(bool)> *)helpText;
  helpText_local._7_1_ = shortOpt;
  psStack_18 = longOpt;
  longOpt_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<bool>",&local_51);
  helpText_00 = callback_local;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_90);
  std::function<void_(bool)>::function(&local_d8,callback);
  std::function<void(std::__cxx11::string_const&)>::
  function<flow::util::Flags::defineBool(std::__cxx11::string_const&,char,std::__cxx11::string_const&,std::function<void(bool)>)::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_b8,
             (anon_class_32_1_dda845c3 *)&local_d8);
  pFVar1 = define(this,longOpt,shortOpt,false,Bool,&local_50,(string *)helpText_00,&local_90,
                  &local_b8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b8);
  defineBool(std::__cxx11::string_const&,char,std::__cxx11::string_const&,std::function<void(bool)>)
  ::$_0::~__0((__0 *)&local_d8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return pFVar1;
}

Assistant:

Flags& Flags::defineBool(
    const std::string& longOpt,
    char shortOpt,
    const std::string& helpText,
    std::function<void(bool)> callback) {

  return define(
      longOpt, shortOpt, false, FlagType::Bool, "<bool>",
      helpText, std::nullopt,
      [=](const std::string& value) {
        if (callback) {
          callback(value == "true");
        }
      });
}